

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::hugeint_t,duckdb::GreaterThanEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  long lVar9;
  const_reference pvVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  hugeint_t *lhs_data;
  bool bVar15;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      iVar11 = 0;
      iVar12 = 0;
      do {
        iVar13 = iVar12;
        if (psVar6 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar6[iVar12];
        }
        iVar14 = iVar13;
        if (psVar7 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar7[iVar13];
        }
        lVar8 = *(long *)(pdVar4 + iVar13 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) != 0) {
          lVar9 = *(long *)(lVar8 + 8 + vVar5);
          if ((lVar9 <= *(long *)(pdVar3 + iVar14 * 0x10 + 8)) &&
             (*(ulong *)(lVar8 + vVar5) <= *(ulong *)(pdVar3 + iVar14 * 0x10) ||
              lVar9 != *(long *)(pdVar3 + iVar14 * 0x10 + 8))) {
            psVar6[iVar11] = (sel_t)iVar13;
            iVar11 = iVar11 + 1;
          }
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return iVar11;
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    iVar11 = 0;
    iVar12 = 0;
    do {
      iVar13 = iVar12;
      if (psVar6 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar6[iVar12];
      }
      iVar14 = iVar13;
      if (psVar7 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar7[iVar13];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar15 = false;
      }
      else {
        bVar15 = (puVar1[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) == 0;
      }
      if ((!bVar15) &&
         (lVar8 = *(long *)(pdVar4 + iVar13 * 8),
         ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) != 0)) {
        lVar9 = *(long *)(lVar8 + 8 + vVar5);
        if ((lVar9 <= *(long *)(pdVar3 + iVar14 * 0x10 + 8)) &&
           (*(ulong *)(lVar8 + vVar5) <= *(ulong *)(pdVar3 + iVar14 * 0x10) ||
            lVar9 != *(long *)(pdVar3 + iVar14 * 0x10 + 8))) {
          psVar6[iVar11] = (sel_t)iVar13;
          iVar11 = iVar11 + 1;
        }
      }
      iVar12 = iVar12 + 1;
    } while (count != iVar12);
    return iVar11;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}